

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O2

_Bool borg_think_home_grab_useless(void)

{
  uint8_t *puVar1;
  int16_t *piVar2;
  byte bVar3;
  borg_item_conflict *pbVar4;
  wchar_t wVar5;
  int iVar6;
  int32_t iVar7;
  angband_constants *paVar8;
  ulong uVar9;
  _Bool _Var10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  borg_item_conflict *item;
  int local_3c;
  uint local_38;
  
  wVar5 = borg_first_empty_inventory_slot();
  if (wVar5 == L'\xffffffff') {
    _Var10 = false;
  }
  else {
    _Var10 = false;
    if (wVar5 + L'\x01' < (int)((uint)z_info->pack_size - borg.trait[0x9e])) {
      borg_notice_home((borg_item_conflict *)0x0,false);
      iVar6 = borg_power_home();
      local_3c = -1;
      local_38 = 0;
      bVar13 = false;
      paVar8 = z_info;
      for (uVar11 = 0; uVar11 < paVar8->store_inven_max; uVar11 = uVar11 + 1) {
        bVar3 = borg_shops[7].ware[uVar11].iqty;
        if (bVar3 != 0) {
          item = borg_shops[7].ware + uVar11;
          uVar9 = (ulong)(uint)sold_item_num;
          if (sold_item_num < L'\x01') {
            uVar9 = 0;
          }
          for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
            if ((sold_item_tval[uVar12] == (uint)item->tval) &&
               (sold_item_sval[uVar12] == (uint)item->sval)) {
              bVar13 = (bool)(bVar13 | sold_item_store[uVar12] == 7);
            }
          }
          if (bVar13) {
            bVar13 = true;
          }
          else {
            if ((item->tval & 0xfe) == 0x16) {
              local_38 = (int)item->pval / (int)(short)(ushort)bVar3 & 0xffff;
            }
            wVar5 = borg_min_item_quantity(item);
            pbVar4 = borg_shops[7].ware;
            puVar1 = &pbVar4[uVar11].iqty;
            *puVar1 = *puVar1 - (char)wVar5;
            if ((item->tval & 0xfe) == 0x16) {
              piVar2 = &pbVar4[uVar11].pval;
              *piVar2 = *piVar2 - (short)wVar5 * (short)local_38;
            }
            bVar13 = false;
            borg_notice_home((borg_item_conflict *)0x0,false);
            iVar7 = borg_power_home();
            memcpy(borg_shops[7].ware + uVar11,borg_safe_shops[7].ware + uVar11,0x388);
            if (iVar6 <= iVar7) {
              local_3c = (int)uVar11;
            }
            paVar8 = z_info;
            if (iVar6 < iVar7) {
              iVar6 = iVar7;
            }
          }
        }
      }
      _Var10 = false;
      borg_notice_home((borg_item_conflict *)0x0,false);
      borg_power_home();
      if (-1 < local_3c) {
        borg.goal.shop = 7;
        borg.goal.ware = (int16_t)local_3c;
        _Var10 = true;
      }
    }
  }
  return _Var10;
}

Assistant:

bool borg_think_home_grab_useless(void)
{
    int     p, n, b_n = -1;
    int32_t s, b_s = 0L;
    int     qty     = 1;
    int     charge_each = 0;
    bool    skip_it = false;
    int     hole    = borg_first_empty_inventory_slot();

    /* Require two empty slots */
    if (hole == -1)
        return false;
    if (hole + 1 >= PACK_SLOTS)
        return false;

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    b_s = borg_power_home();

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* skip stuff if we sold bought it */
        for (p = 0; p < sold_item_num; p++) {
            if (sold_item_tval[p] == item->tval
                && sold_item_sval[p] == item->sval
                && sold_item_store[p] == BORG_HOME)
                skip_it = true;
        }
        if (skip_it == true)
            continue;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= charge_each * qty;

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* Evaluate the home */
        s = borg_power_home();

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n], &borg_safe_shops[BORG_HOME].ware[n],
            sizeof(borg_item));

        /* Ignore "bad" sales */
        if (s < b_s)
            continue;

        /* Maintain the "best" */
        b_n = n;
        b_s = s;
    }

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    s = borg_power_home();

    /* Stockpile */
    if (b_n >= 0) {
        /* Visit the home */
        borg.goal.shop = BORG_HOME;

        /* Grab that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Assume not */
    return false;
}